

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

string * __thiscall cppcms::application::url(application *this,string *key)

{
  string *key_00;
  context *in_RDI;
  ostringstream ss;
  context *this_00;
  locale local_1a0 [8];
  application *in_stack_fffffffffffffe68;
  ostringstream local_190 [400];
  
  this_00 = in_RDI;
  std::__cxx11::ostringstream::ostringstream(local_190);
  context(in_stack_fffffffffffffe68);
  http::context::locale(in_RDI);
  std::ios::imbue((locale *)&stack0xfffffffffffffe68);
  std::locale::~locale((locale *)&stack0xfffffffffffffe68);
  std::locale::~locale(local_1a0);
  key_00 = (string *)mapper((application *)0x3b168c);
  url_mapper::map((url_mapper *)this_00,(ostream *)in_RDI,key_00);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return (string *)this_00;
}

Assistant:

std::string application::url(std::string const &key)
{
	std::ostringstream ss;
	ss.imbue(context().locale());
	mapper().map(ss,key);
	return ss.str();
}